

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O0

void __thiscall QTextBrowser::focusOutEvent(QTextBrowser *this,QFocusEvent *ev)

{
  bool bVar1;
  QTextBrowserPrivate *this_00;
  QWidget *in_RSI;
  QWidgetTextControl *in_RDI;
  long in_FS_OFFSET;
  QTextBrowserPrivate *d;
  undefined8 in_stack_ffffffffffffffb8;
  TextInteractionFlag other;
  QCursor *this_01;
  QWidget *e;
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_14;
  QCursor local_10;
  long local_8;
  
  other = (TextInteractionFlag)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTextBrowser *)0x6df17f);
  e = (this_00->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.viewport;
  QWidgetTextControl::textInteractionFlags(in_RDI);
  local_14.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
       (QFlagsStorage<Qt::TextInteractionFlag>)
       QFlags<Qt::TextInteractionFlag>::operator&((QFlags<Qt::TextInteractionFlag> *)in_RDI,other);
  bVar1 = QFlags<Qt::TextInteractionFlag>::operator!((QFlags<Qt::TextInteractionFlag> *)&local_14);
  if (bVar1) {
    QCursor::QCursor(&local_10,&this_00->oldCursor);
  }
  else {
    QCursor::QCursor(&local_10,IBeamCursor);
  }
  this_01 = &local_10;
  QWidget::setCursor(in_RSI,(QCursor *)this_00);
  QCursor::~QCursor(this_01);
  QTextEdit::focusOutEvent((QTextEdit *)this_00,(QFocusEvent *)e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextBrowser::focusOutEvent(QFocusEvent *ev)
{
#ifndef QT_NO_CURSOR
    Q_D(QTextBrowser);
    d->viewport->setCursor((!(d->control->textInteractionFlags() & Qt::TextEditable)) ? d->oldCursor : Qt::IBeamCursor);
#endif
    QTextEdit::focusOutEvent(ev);
}